

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O3

void la_miam_file_segment_format_text(la_vstring *vstr,void *data,int indent)

{
  char *pcVar1;
  uint uVar2;
  
  uVar2 = indent + 1;
  la_vstring_append_sprintf
            (vstr,"%*sFile ID: %u\n",(ulong)uVar2,"",(ulong)*(ushort *)((long)data + 8));
  la_vstring_append_sprintf
            (vstr,"%*sSegment ID: %u\n",(ulong)uVar2,"",(ulong)*(ushort *)((long)data + 10));
  pcVar1 = la_reasm_status_name_get(*(la_reasm_status *)((long)data + 0xc));
  la_vstring_append_sprintf(vstr,"%*sReassembly: %s\n",(ulong)uVar2,"",pcVar1);
  return;
}

Assistant:

static void la_miam_file_segment_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_file_segment_msg const *msg = data;
	indent++;
	LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	LA_ISPRINTF(vstr, indent, "Segment ID: %u\n", msg->segment_id);
	LA_ISPRINTF(vstr, indent, "Reassembly: %s\n", la_reasm_status_name_get(msg->reasm_status));
}